

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

insert_result * __thiscall
crnlib::
hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
::insert(insert_result *__return_storage_ptr__,
        hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
        *this,vec<2U,_float> *k,uint *v)

{
  float fVar1;
  float fVar2;
  raw_node *prVar3;
  uint32 uVar4;
  uint uVar5;
  raw_node *prVar6;
  uint new_hash_size;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  
  (__return_storage_ptr__->first).m_pTable = (hash_map_type *)0x0;
  (__return_storage_ptr__->first).m_index = 0;
  __return_storage_ptr__->second = false;
  if ((this->m_values).m_size == 0) {
    uVar8 = 0;
LAB_00187140:
    new_hash_size = 4;
    if (4 < uVar8 * 2) {
      new_hash_size = uVar8 * 2;
    }
    rehash(this,new_hash_size);
    if ((this->m_values).m_size != 0) {
      uVar4 = fast_hash(k,8);
      uVar5 = uVar4 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
      prVar3 = (this->m_values).m_p;
      prVar6 = prVar3 + uVar5;
      uVar10 = uVar5;
      if (prVar3[uVar5].m_bits[0xc] != '\0') {
        bVar11 = true;
        lVar9 = 0;
        while( true ) {
          fVar1 = *(float *)(prVar6->m_bits + lVar9 * 4);
          fVar2 = k->m_s[lVar9];
          if (!bVar11) break;
          lVar9 = 1;
          bVar11 = false;
          if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) break;
        }
        if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) goto LAB_001871bd;
        uVar7 = (this->m_values).m_size - 1;
        do {
          bVar11 = uVar10 == 0;
          prVar6 = prVar6 + -1;
          uVar10 = uVar10 - 1;
          if (bVar11) {
            prVar6 = prVar3 + uVar7;
            uVar10 = uVar7;
          }
          if (uVar5 == uVar10) goto LAB_00187251;
          if (prVar6->m_bits[0xc] == '\0') goto LAB_00187225;
          bVar11 = true;
          lVar9 = 0;
          while( true ) {
            fVar1 = *(float *)(prVar6->m_bits + lVar9 * 4);
            fVar2 = k->m_s[lVar9];
            if (!bVar11) break;
            lVar9 = 1;
            bVar11 = false;
            if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) break;
          }
        } while ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2)));
        bVar11 = false;
        goto LAB_00187246;
      }
LAB_00187225:
      if (this->m_num_valid < this->m_grow_threshold) goto LAB_0018722f;
    }
LAB_00187251:
    crnlib_fail("\"insert() failed\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_hash_map.h"
                ,0x204);
  }
  else {
    uVar4 = fast_hash(k,8);
    uVar5 = uVar4 * -0x61c88647 >> ((byte)this->m_hash_shift & 0x1f);
    prVar3 = (this->m_values).m_p;
    prVar6 = prVar3 + uVar5;
    uVar10 = uVar5;
    if (prVar3[uVar5].m_bits[0xc] == '\0') {
LAB_0018712e:
      if (this->m_grow_threshold <= this->m_num_valid) {
        uVar8 = (this->m_values).m_size;
        goto LAB_00187140;
      }
LAB_0018722f:
      *(undefined8 *)prVar6->m_bits = *(undefined8 *)k->m_s;
      *(uint *)(prVar6->m_bits + 8) = *v;
      prVar6->m_bits[0xc] = '\x01';
      this->m_num_valid = this->m_num_valid + 1;
      bVar11 = true;
    }
    else {
      bVar11 = true;
      lVar9 = 0;
      while( true ) {
        fVar1 = *(float *)(prVar6->m_bits + lVar9 * 4);
        fVar2 = k->m_s[lVar9];
        if (!bVar11) break;
        lVar9 = 1;
        bVar11 = false;
        if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) break;
      }
      if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
        uVar8 = (this->m_values).m_size;
        do {
          bVar11 = uVar10 == 0;
          prVar6 = prVar6 + -1;
          uVar10 = uVar10 - 1;
          if (bVar11) {
            prVar6 = prVar3 + (uVar8 - 1);
            uVar10 = uVar8 - 1;
          }
          if (uVar5 == uVar10) goto LAB_00187140;
          if (prVar6->m_bits[0xc] == '\0') goto LAB_0018712e;
          bVar11 = true;
          lVar9 = 0;
          while( true ) {
            fVar1 = *(float *)(prVar6->m_bits + lVar9 * 4);
            fVar2 = k->m_s[lVar9];
            if (!bVar11) break;
            lVar9 = 1;
            bVar11 = false;
            if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) break;
          }
        } while ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2)));
        bVar11 = false;
      }
      else {
LAB_001871bd:
        bVar11 = false;
      }
    }
LAB_00187246:
    (__return_storage_ptr__->first).m_pTable = this;
    (__return_storage_ptr__->first).m_index = uVar10;
    __return_storage_ptr__->second = bVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
        {
            insert_result result;
            if (!insert_no_grow(result, k, v))
            {
                grow();

                // This must succeed.
                if (!insert_no_grow(result, k, v))
                {
                    CRNLIB_FAIL("insert() failed");
                }
            }

            return result;
        }